

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# trees.cpp
# Opt level: O3

void __thiscall IZDeflate::gen_bitlen(IZDeflate *this,tree_desc *desc)

{
  short *psVar1;
  ushort uVar2;
  ushort uVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  ct_data *pcVar7;
  ct_data *pcVar8;
  int *piVar9;
  bool bVar10;
  long lVar11;
  int iVar12;
  long lVar13;
  int iVar14;
  long lVar15;
  ulong uVar16;
  int iVar17;
  int iVar18;
  uint uVar19;
  ush *puVar20;
  
  pcVar7 = desc->dyn_tree;
  pcVar8 = desc->static_tree;
  piVar9 = desc->extra_bits;
  iVar4 = desc->extra_base;
  iVar5 = desc->max_code;
  iVar6 = desc->max_length;
  lVar11 = (long)iVar6;
  this->bl_count[8] = 0;
  this->bl_count[9] = 0;
  this->bl_count[10] = 0;
  this->bl_count[0xb] = 0;
  this->bl_count[0xc] = 0;
  this->bl_count[0xd] = 0;
  this->bl_count[0xe] = 0;
  this->bl_count[0xf] = 0;
  this->bl_count[0] = 0;
  this->bl_count[1] = 0;
  this->bl_count[2] = 0;
  this->bl_count[3] = 0;
  this->bl_count[4] = 0;
  this->bl_count[5] = 0;
  this->bl_count[6] = 0;
  this->bl_count[7] = 0;
  pcVar7[this->heap[this->heap_max]].dl.dad = 0;
  if ((long)this->heap_max < 0x23c) {
    iVar14 = 0;
    lVar13 = (long)this->heap_max + 0x45a;
    do {
      iVar12 = this->extra_lbits[lVar13];
      uVar2 = pcVar7[pcVar7[iVar12].dl.dad].dl.dad;
      iVar17 = iVar6;
      if ((int)(uint)uVar2 < iVar6) {
        iVar17 = uVar2 + 1;
      }
      pcVar7[iVar12].dl.dad = (ush)iVar17;
      if (iVar12 <= iVar5) {
        this->bl_count[iVar17] = this->bl_count[iVar17] + 1;
        iVar18 = 0;
        if (iVar4 <= iVar12) {
          iVar18 = piVar9[iVar12 - iVar4];
        }
        uVar3 = pcVar7[iVar12].fc.freq;
        this->opt_len = this->opt_len + (long)(iVar17 + iVar18) * (ulong)uVar3;
        if (pcVar8 != (ct_data *)0x0) {
          this->static_len =
               this->static_len + ((long)iVar18 + (ulong)pcVar8[iVar12].dl.dad) * (ulong)uVar3;
        }
      }
      iVar14 = iVar14 + (uint)(iVar6 <= (int)(uint)uVar2);
      iVar12 = (int)lVar13;
      lVar13 = lVar13 + 1;
    } while (iVar12 != 0x695);
    if (iVar14 != 0) {
      lVar15 = (lVar11 << 0x20) + 0x100000000;
      lVar13 = lVar15;
      puVar20 = this->bl_count + lVar11;
      do {
        do {
          lVar13 = lVar13 + -0x100000000;
          psVar1 = (short *)(puVar20 + -1);
          puVar20 = puVar20 + -1;
        } while (*psVar1 == 0);
        *puVar20 = *psVar1 - 1;
        psVar1 = (short *)((long)this->bl_count + (lVar13 >> 0x1f));
        *psVar1 = *psVar1 + 2;
        this->bl_count[lVar11] = this->bl_count[lVar11] - 1;
        bVar10 = 2 < iVar14;
        lVar13 = lVar15;
        puVar20 = this->bl_count + lVar11;
        iVar14 = iVar14 + -2;
      } while (bVar10);
      if (iVar6 != 0) {
        uVar16 = 0x23d;
LAB_00127d37:
        uVar19 = (uint)this->bl_count[lVar11];
        do {
          lVar13 = 0;
          do {
            if (uVar19 == 0) {
              lVar11 = lVar11 + -1;
              if (lVar11 == 0) {
                return;
              }
              goto LAB_00127d37;
            }
            iVar4 = this->heap[(long)(int)uVar16 + lVar13 + -1];
            lVar13 = lVar13 + -1;
          } while (iVar5 < iVar4);
          if (pcVar7[iVar4].dl.dad != (ushort)lVar11) {
            this->opt_len =
                 this->opt_len +
                 (ulong)pcVar7[iVar4].fc.freq * (lVar11 - (ulong)pcVar7[iVar4].dl.dad);
            pcVar7[iVar4].dl.dad = (ushort)lVar11;
          }
          uVar16 = (uVar16 & 0xffffffff) + lVar13;
          uVar19 = uVar19 - 1;
        } while( true );
      }
    }
  }
  return;
}

Assistant:

void IZDeflate::gen_bitlen(tree_desc near *desc)
    // tree_desc near *desc; /* the tree descriptor */
{
    ct_data near *tree  = desc->dyn_tree;
    int near *extra     = desc->extra_bits;
    int base            = desc->extra_base;
    int max_code        = desc->max_code;
    int max_length      = desc->max_length;
    ct_data near *stree = desc->static_tree;
    int h;              /* heap index */
    int n, m;           /* iterate over the tree elements */
    int bits;           /* bit length */
    int xbits;          /* extra bits */
    ush f;              /* frequency */
    int overflow = 0;   /* number of elements with bit length too large */

    for (bits = 0; bits <= MAX_BITS; bits++) bl_count[bits] = 0;

    /* In a first pass, compute the optimal bit lengths (which may
     * overflow in the case of the bit length tree).
     */
    tree[heap[heap_max]].Len = 0; /* root of the heap */

    for (h = heap_max+1; h < HEAP_SIZE; h++) {
        n = heap[h];
        bits = tree[tree[n].Dad].Len + 1;
        if (bits > max_length) bits = max_length, overflow++;
        tree[n].Len = (ush)bits;
        /* We overwrite tree[n].Dad which is no longer needed */

        if (n > max_code) continue; /* not a leaf node */

        bl_count[bits]++;
        xbits = 0;
        if (n >= base) xbits = extra[n-base];
        f = tree[n].Freq;
        opt_len += (ulg)f * (bits + xbits);
        if (stree) static_len += (ulg)f * (stree[n].Len + xbits);
    }
    if (overflow == 0) return;

    Trace((stderr,"\nbit length overflow\n"));
    /* This happens for example on obj2 and pic of the Calgary corpus */

    /* Find the first bit length which could increase: */
    do {
        bits = max_length-1;
        while (bl_count[bits] == 0) bits--;
        bl_count[bits]--;           /* move one leaf down the tree */
        bl_count[bits+1] += (ush)2; /* move one overflow item as its brother */
        bl_count[max_length]--;
        /* The brother of the overflow item also moves one step up,
         * but this does not affect bl_count[max_length]
         */
        overflow -= 2;
    } while (overflow > 0);

    /* Now recompute all bit lengths, scanning in increasing frequency.
     * h is still equal to HEAP_SIZE. (It is simpler to reconstruct all
     * lengths instead of fixing only the wrong ones. This idea is taken
     * from 'ar' written by Haruhiko Okumura.)
     */
    for (bits = max_length; bits != 0; bits--) {
        n = bl_count[bits];
        while (n != 0) {
            m = heap[--h];
            if (m > max_code) continue;
            if (tree[m].Len != (ush)bits) {
                Trace((stderr,"code %d bits %d->%d\n", m, tree[m].Len, bits));
                opt_len += ((long)bits-(long)tree[m].Len)*(long)tree[m].Freq;
                tree[m].Len = (ush)bits;
            }
            n--;
        }
    }
}